

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  TargetType TVar4;
  cmGeneratorTarget *this_00;
  long *plVar5;
  cmGeneratorTarget *pcVar6;
  size_type *psVar7;
  GeneratorExpressionContent *content_00;
  string result;
  cmGeneratorTarget *target;
  string name;
  string local_b8;
  string local_98;
  cmGeneratorTarget *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  content_00 = content;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
  bVar3 = cmGeneratorExpression::IsValidTargetName(&local_50);
  if (bVar3) {
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_50);
    local_78 = this_00;
    if (this_00 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
      std::operator+(&local_70,"No target \"",&local_50);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      reportError(context,&local_98,&local_b8);
    }
    else {
      TVar4 = cmGeneratorTarget::GetType(this_00);
      if (((int)TVar4 < 4) ||
         (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 == UNKNOWN_LIBRARY)) {
        if ((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) ||
           ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(dagChecker,this_00),
            !bVar3 && ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker),
                       !bVar3 || (pcVar6 = cmGeneratorExpressionDAGChecker::TopTarget(dagChecker),
                                 this_00 != pcVar6)))))) {
          std::
          _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
          ::_M_insert_unique<cmGeneratorTarget*const&>
                    ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                      *)&context->DependTargets,&local_78);
          std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_unique<cmGeneratorTarget_const*const&>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                      *)&context->AllTargets,&local_78);
          TargetFilesystemArtifactResultCreator<ArtifactLinkerTag>::Create_abi_cxx11_
                    (&local_98,(TargetFilesystemArtifactResultCreator<ArtifactLinkerTag> *)local_78,
                     (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,content_00
                    );
          if (context->HadError == true) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&local_98);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          goto LAB_003858e2;
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,
                   "Expressions which require the linker language may not be used while evaluating link libraries"
                   ,"");
        reportError(context,&local_98,&local_b8);
        goto LAB_003856ae;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
      std::operator+(&local_70,"Target \"",&local_50);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      reportError(context,&local_98,&local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_003858ac:
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Expression syntax not recognized.","");
    reportError(context,&local_98,&local_b8);
LAB_003856ae:
    local_70.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_003858ac;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_003858e2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    // Lookup the referenced target.
    std::string name = parameters.front();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Target \"" + name +
                      "\" is not an executable or library.");
      return std::string();
    }
    if (dagChecker &&
        (dagChecker->EvaluatingLinkLibraries(target) ||
         (dagChecker->EvaluatingSources() &&
          target == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }